

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meter.cpp
# Opt level: O3

void __thiscall Meter::paintEvent(Meter *this,QPaintEvent *param_1)

{
  QPainter p;
  DrawParams params;
  undefined1 local_70 [16];
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  
  QPainter::QPainter((QPainter *)local_70,(QPaintDevice *)&this->field_0x10);
  QPainter::setRenderHint((RenderHint)(QPainter *)local_70,true);
  local_70._8_8_ = 1.0;
  uStack_60 = 0x3ff0000000000000;
  QPainter::translate((QPointF *)local_70);
  local_58 = 0;
  uStack_50 = 0;
  local_70._8_8_ = 0.0;
  uStack_60 = 0;
  MeterPrivate::drawBackground((this->d).d,(QPainter *)local_70,(DrawParams *)(local_70 + 8));
  MeterPrivate::drawRanges((this->d).d,(QPainter *)local_70,(DrawParams *)(local_70 + 8));
  MeterPrivate::drawScale((this->d).d,(QPainter *)local_70,(DrawParams *)(local_70 + 8));
  MeterPrivate::drawLabels((this->d).d,(QPainter *)local_70,(DrawParams *)(local_70 + 8));
  MeterPrivate::drawNeedle((this->d).d,(QPainter *)local_70,(DrawParams *)(local_70 + 8));
  QPainter::~QPainter((QPainter *)local_70);
  return;
}

Assistant:

void
Meter::paintEvent( QPaintEvent * )
{
	QPainter p( this );
	p.setRenderHint( QPainter::Antialiasing );
	p.translate( 1.0, 1.0 );

	MeterPrivate::DrawParams params;

	d->drawBackground( p, params );
	d->drawRanges( p, params );
	d->drawScale( p, params );
	d->drawLabels( p, params );
	d->drawNeedle( p, params );
}